

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> * __thiscall
duckdb::LocalTableManager::MoveEntries
          (reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> *__return_storage_ptr__,
          LocalTableManager *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&__return_storage_ptr__->_M_h,&this->table_storage);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

reference_map_t<DataTable, shared_ptr<LocalTableStorage>> LocalTableManager::MoveEntries() {
	lock_guard<mutex> l(table_storage_lock);
	return std::move(table_storage);
}